

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O3

bool __thiscall
SVGChart::LinTickIterator::InitFromRanges
          (LinTickIterator *this,float inParRange,float inOrthoScreenRange,float inDivGuess,
          TickInfo *ioTickInfo)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  
  if ((1e-20 < inDivGuess) && (fVar4 = TickInfo::RoundSpan(inParRange / inDivGuess), 0.0 <= fVar4))
  {
    uVar3 = -(uint)(inParRange / fVar4 < 1.0);
    fVar4 = (float)(~uVar3 & (uint)fVar4 | (uint)inParRange & uVar3);
    ioTickInfo->mMajorTickSpan = fVar4;
    ioTickInfo->mTickDivision = 5;
    if (ioTickInfo->mAutoTickSize == true) {
      fVar5 = floorf(inOrthoScreenRange * 0.01 + 0.5);
      iVar1 = 1;
      if (1 < (int)fVar5) {
        iVar1 = (int)fVar5;
      }
      ioTickInfo->mMinorTickScreenSize = iVar1;
      fVar5 = floorf(inOrthoScreenRange * 0.02 + 0.5);
      iVar2 = iVar1 + 1;
      if (iVar1 + 1 <= (int)fVar5) {
        iVar2 = (int)fVar5;
      }
      ioTickInfo->mMajorTickScreenSize = iVar2;
    }
    TickInfo::MakeFormatString(fVar4,&ioTickInfo->mFormatString);
    return true;
  }
  return false;
}

Assistant:

bool LinTickIterator::InitFromRanges (float inParRange, float inOrthoScreenRange, float inDivGuess, TickInfo &ioTickInfo) const {
      if (inDivGuess <= kFloatSmall) {
        return false;
      }
      float thePreferredSpan = TickInfo::RoundSpan (inParRange/inDivGuess);
      if (thePreferredSpan < 0) {
        return false;
      }

      float thePreferredNrOfTicks = inParRange/thePreferredSpan;
      if (thePreferredNrOfTicks <1) {
        ioTickInfo.mMajorTickSpan = inParRange;
      }
      else {
        ioTickInfo.mMajorTickSpan = thePreferredSpan;
      }

      ioTickInfo.mTickDivision = 5;
      if (ioTickInfo.mAutoTickSize) {
          ioTickInfo.mMinorTickScreenSize = PMax (kMinMinorTickScreenSize, PPlot::Round (inOrthoScreenRange*kRelMinorTickSize));
          ioTickInfo.mMajorTickScreenSize = PMax (ioTickInfo.mMinorTickScreenSize+1, PPlot::Round (inOrthoScreenRange*kRelMajorTickSize));
      }

      TickInfo::MakeFormatString (ioTickInfo.mMajorTickSpan, ioTickInfo.mFormatString);
      return true;
    }